

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeCornerScaledAngles
          (IntrinsicGeometryInterface *this)

{
  SurfaceMesh *pSVar1;
  size_t sVar2;
  bool bVar3;
  pointer puVar4;
  size_t sVar5;
  MeshData<geometrycentral::surface::Corner,_double> local_60;
  
  if ((this->cornerAnglesQ).super_DependentQuantity.computed == false) {
    if ((this->cornerAnglesQ).super_DependentQuantity.evaluateFunc.super__Function_base._M_manager
        == (_Manager_type)0x0) goto LAB_001843c7;
    (*(this->cornerAnglesQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->cornerAnglesQ).super_DependentQuantity.evaluateFunc);
    (this->cornerAnglesQ).super_DependentQuantity.computed = true;
  }
  if ((this->vertexAngleSumsQ).super_DependentQuantity.computed == false) {
    if ((this->vertexAngleSumsQ).super_DependentQuantity.evaluateFunc.super__Function_base.
        _M_manager == (_Manager_type)0x0) {
LAB_001843c7:
      ::std::__throw_bad_function_call();
    }
    (*(this->vertexAngleSumsQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->vertexAngleSumsQ).super_DependentQuantity.evaluateFunc);
    (this->vertexAngleSumsQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Corner,_double>::MeshData
            (&local_60,(this->super_BaseGeometryInterface).mesh);
  MeshData<geometrycentral::surface::Corner,_double>::operator=(&this->cornerScaledAngles,&local_60)
  ;
  MeshData<geometrycentral::surface::Corner,_double>::~MeshData(&local_60);
  pSVar1 = (this->super_BaseGeometryInterface).mesh;
  sVar2 = pSVar1->nHalfedgesFillCount;
  if ((sVar2 == 0) ||
     ((puVar4 = (pSVar1->heNextArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start, *puVar4 != 0xffffffffffffffff &&
      (*(pSVar1->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start < pSVar1->nFacesFillCount)))) {
    sVar5 = 0;
  }
  else {
    sVar5 = 1;
    if (sVar2 != 1) {
      while ((puVar4[sVar5] == 0xffffffffffffffff ||
             (pSVar1->nFacesFillCount <=
              (pSVar1->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[sVar5]))) {
        sVar5 = sVar5 + 1;
        if (sVar2 == sVar5) {
          return;
        }
      }
    }
  }
  if (sVar5 != sVar2) {
    puVar4 = (pSVar1->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      local_60.defaultValue = (double)puVar4[sVar5];
      local_60.mesh = pSVar1;
      bVar3 = Vertex::isBoundary((Vertex *)&local_60);
      puVar4 = (pSVar1->heVertexArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->cornerScaledAngles).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_storage.m_data[sVar5] =
           ((double)((ulong)bVar3 * 0x400921fb54442d18 + (ulong)!bVar3 * 0x401921fb54442d18) /
           (this->vertexAngleSums).data.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
           [puVar4[sVar5]]) *
           (this->cornerAngles).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data[sVar5];
      sVar5 = sVar5 + 1;
      if (sVar5 == sVar2) break;
      while (((pSVar1->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[sVar5] == 0xffffffffffffffff ||
             (pSVar1->nFacesFillCount <=
              (pSVar1->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[sVar5]))) {
        sVar5 = sVar5 + 1;
        if (sVar2 == sVar5) {
          return;
        }
      }
      if (sVar2 == sVar5) {
        return;
      }
    }
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeCornerScaledAngles() {
  cornerAnglesQ.ensureHave();
  vertexAngleSumsQ.ensureHave();

  cornerScaledAngles = CornerData<double>(mesh);

  for (Corner c : mesh.corners()) {
    if (c.vertex().isBoundary()) {
      double s = PI / vertexAngleSums[c.vertex()];
      cornerScaledAngles[c] = s * cornerAngles[c];
    } else {
      double s = 2.0 * PI / vertexAngleSums[c.vertex()];
      cornerScaledAngles[c] = s * cornerAngles[c];
    }
  }
}